

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatticeFactory.hpp
# Opt level: O1

LatticeFactory * OpenMD::LatticeFactory::getInstance(void)

{
  if (getInstance()::instance == '\0') {
    getInstance();
  }
  return &getInstance::instance;
}

Assistant:

static LatticeFactory& getInstance() {
      static LatticeFactory instance {};
      return instance;
    }